

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O0

char * evutil_inet_ntop(int af,void *src,char *dst,size_t len)

{
  uint32_t uVar1;
  int iVar2;
  size_t sVar3;
  char **ppcVar4;
  bool bVar5;
  uint16_t local_b8 [4];
  uint16_t words [8];
  int curGapLen;
  int curGapPos;
  int i;
  int longestGapPos;
  int longestGapLen;
  char *cp;
  char buf [64];
  in6_addr *addr;
  int r;
  uint32_t a;
  in_addr *in;
  size_t len_local;
  char *dst_local;
  void *src_local;
  char *pcStack_10;
  int af_local;
  
  pcStack_10 = dst;
  if (af == 2) {
    uVar1 = ntohl(*src);
    iVar2 = evutil_snprintf(dst,len,"%d.%d.%d.%d",(ulong)(uVar1 >> 0x18),
                            (ulong)(uVar1 >> 0x10 & 0xff),(ulong)(uVar1 >> 8 & 0xff),uVar1 & 0xff);
    if ((iVar2 < 0) || (len <= (ulong)(long)iVar2)) {
      pcStack_10 = (char *)0x0;
    }
  }
  else if (af == 10) {
    buf._56_8_ = src;
    i = 0;
    curGapPos = -1;
    words[6] = 0;
    words[7] = 0;
    for (curGapLen = 0; curGapLen < 8; curGapLen = curGapLen + 1) {
      local_b8[curGapLen] =
           (ushort)*(byte *)((long)src + (long)(curGapLen << 1)) * 0x100 +
           (ushort)*(byte *)((long)src + (long)(curGapLen * 2 + 1));
    }
    if (((((local_b8[0] == 0) && (local_b8[1] == 0)) && (local_b8[2] == 0)) &&
        ((local_b8[3] == 0 && (words[0] == 0)))) &&
       (((words[1] == 0 && ((words[2] != 0 && (words[3] != 0)))) || (words[1] == 0xffff)))) {
      if (words[1] == 0) {
        evutil_snprintf((char *)&cp,0x40,"::%d.%d.%d.%d",(ulong)*(byte *)((long)src + 0xc),
                        (ulong)*(byte *)((long)src + 0xd),(ulong)*(byte *)((long)src + 0xe),
                        (uint)*(byte *)((long)src + 0xf));
      }
      else {
        evutil_snprintf((char *)&cp,0x40,"::%x:%d.%d.%d.%d",(ulong)words[1],
                        (ulong)*(byte *)((long)src + 0xc),(ulong)*(byte *)((long)src + 0xd),
                        (uint)*(byte *)((long)src + 0xe),(uint)*(byte *)((long)src + 0xf));
      }
      sVar3 = strlen((char *)&cp);
      if (len < sVar3) {
        pcStack_10 = (char *)0x0;
      }
      else {
        event_strlcpy_(dst,(char *)&cp,len);
      }
    }
    else {
      curGapLen = 0;
      while (iVar2 = curGapLen, curGapLen < 8) {
        if (local_b8[curGapLen] == 0) {
          words[6] = 1;
          words[7] = 0;
          while( true ) {
            curGapLen = curGapLen + 1;
            bVar5 = false;
            if (curGapLen < 8) {
              bVar5 = local_b8[curGapLen] == 0;
            }
            if (!bVar5) break;
            words._12_4_ = words._12_4_ + 1;
          }
          if (i < (int)words._12_4_) {
            curGapPos = iVar2;
            i._0_2_ = words[6];
            i._2_2_ = words[7];
          }
        }
        else {
          curGapLen = curGapLen + 1;
        }
      }
      if (i < 2) {
        curGapPos = -1;
      }
      _longestGapPos = &cp;
      for (curGapLen = 0; curGapLen < 8; curGapLen = curGapLen + 1) {
        if ((local_b8[curGapLen] == 0) && (curGapPos == curGapLen)) {
          if (curGapLen == 0) {
            *(undefined1 *)_longestGapPos = 0x3a;
            _longestGapPos = (char **)((long)_longestGapPos + 1);
          }
          *(undefined1 *)_longestGapPos = 0x3a;
          while( true ) {
            bVar5 = false;
            if (curGapLen < 8) {
              bVar5 = local_b8[curGapLen] == 0;
            }
            if (!bVar5) break;
            curGapLen = curGapLen + 1;
          }
          curGapLen = curGapLen + -1;
          _longestGapPos = (char **)((long)_longestGapPos + 1);
        }
        else {
          evutil_snprintf((char *)_longestGapPos,0x40 - ((long)_longestGapPos - (long)&cp),"%x",
                          (ulong)local_b8[curGapLen]);
          sVar3 = strlen((char *)_longestGapPos);
          ppcVar4 = (char **)(sVar3 + (long)_longestGapPos);
          _longestGapPos = ppcVar4;
          if (curGapLen != 7) {
            _longestGapPos = (char **)((long)ppcVar4 + 1);
            *(undefined1 *)ppcVar4 = 0x3a;
          }
        }
      }
      *(undefined1 *)_longestGapPos = 0;
      sVar3 = strlen((char *)&cp);
      if (len < sVar3) {
        pcStack_10 = (char *)0x0;
      }
      else {
        event_strlcpy_(dst,(char *)&cp,len);
      }
    }
  }
  else {
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

const char *
evutil_inet_ntop(int af, const void *src, char *dst, size_t len)
{
#if defined(EVENT__HAVE_INET_NTOP) && !defined(USE_INTERNAL_NTOP)
	return inet_ntop(af, src, dst, len);
#else
	if (af == AF_INET) {
		const struct in_addr *in = src;
		const ev_uint32_t a = ntohl(in->s_addr);
		int r;
		r = evutil_snprintf(dst, len, "%d.%d.%d.%d",
		    (int)(ev_uint8_t)((a>>24)&0xff),
		    (int)(ev_uint8_t)((a>>16)&0xff),
		    (int)(ev_uint8_t)((a>>8 )&0xff),
		    (int)(ev_uint8_t)((a    )&0xff));
		if (r<0||(size_t)r>=len)
			return NULL;
		else
			return dst;
#ifdef AF_INET6
	} else if (af == AF_INET6) {
		const struct in6_addr *addr = src;
		char buf[64], *cp;
		int longestGapLen = 0, longestGapPos = -1, i,
			curGapPos = -1, curGapLen = 0;
		ev_uint16_t words[8];
		for (i = 0; i < 8; ++i) {
			words[i] =
			    (((ev_uint16_t)addr->s6_addr[2*i])<<8) + addr->s6_addr[2*i+1];
		}
		if (words[0] == 0 && words[1] == 0 && words[2] == 0 && words[3] == 0 &&
		    words[4] == 0 && ((words[5] == 0 && words[6] && words[7]) ||
			(words[5] == 0xffff))) {
			/* This is an IPv4 address. */
			if (words[5] == 0) {
				evutil_snprintf(buf, sizeof(buf), "::%d.%d.%d.%d",
				    addr->s6_addr[12], addr->s6_addr[13],
				    addr->s6_addr[14], addr->s6_addr[15]);
			} else {
				evutil_snprintf(buf, sizeof(buf), "::%x:%d.%d.%d.%d", words[5],
				    addr->s6_addr[12], addr->s6_addr[13],
				    addr->s6_addr[14], addr->s6_addr[15]);
			}
			if (strlen(buf) > len)
				return NULL;
			strlcpy(dst, buf, len);
			return dst;
		}
		i = 0;
		while (i < 8) {
			if (words[i] == 0) {
				curGapPos = i++;
				curGapLen = 1;
				while (i<8 && words[i] == 0) {
					++i; ++curGapLen;
				}
				if (curGapLen > longestGapLen) {
					longestGapPos = curGapPos;
					longestGapLen = curGapLen;
				}
			} else {
				++i;
			}
		}
		if (longestGapLen<=1)
			longestGapPos = -1;

		cp = buf;
		for (i = 0; i < 8; ++i) {
			if (words[i] == 0 && longestGapPos == i) {
				if (i == 0)
					*cp++ = ':';
				*cp++ = ':';
				while (i < 8 && words[i] == 0)
					++i;
				--i; /* to compensate for loop increment. */
			} else {
				evutil_snprintf(cp,
								sizeof(buf)-(cp-buf), "%x", (unsigned)words[i]);
				cp += strlen(cp);
				if (i != 7)
					*cp++ = ':';
			}
		}
		*cp = '\0';
		if (strlen(buf) > len)
			return NULL;
		strlcpy(dst, buf, len);
		return dst;
#endif
	} else {
		return NULL;
	}
#endif
}